

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O2

vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> * __thiscall
ELFIO::elfio::get_ordered_segments
          (vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *__return_storage_ptr__,
          elfio *this)

{
  iterator *this_00;
  elfio *peVar1;
  pointer puVar2;
  segment *psVar3;
  _Head_base<0UL,_ELFIO::segment_*,_false> seg1;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  reference ppsVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppsVar8;
  unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_> *seg;
  pointer puVar9;
  size_t i;
  ulong uVar10;
  long __n;
  ulong __n_00;
  segment *seg_1;
  deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> worklist;
  _Head_base<0UL,_ELFIO::segment_*,_false> local_88;
  _Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> local_80;
  
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::_Deque_base(&local_80);
  peVar1 = (this->segments).parent;
  std::vector<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::reserve
            (__return_storage_ptr__,
             (ulong)((uint)(*(int *)&(peVar1->segments_).
                                     super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(peVar1->segments_).
                                    super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffff));
  peVar1 = (this->segments).parent;
  puVar2 = (peVar1->segments_).
           super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (peVar1->segments_).
                super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1) {
    local_88._M_head_impl =
         (puVar9->_M_t).super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>.
         _M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
         super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
    std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*>
              ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)&local_80,
               &local_88._M_head_impl);
  }
  this_00 = &local_80._M_impl.super__Deque_impl_data._M_start;
  __n_00 = 0;
  uVar10 = 0;
  while( true ) {
    sVar6 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::size
                      ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&local_80);
    if (sVar6 <= uVar10) break;
    if (uVar10 != __n_00) {
      ppsVar7 = std::_Deque_iterator<ELFIO::segment_*,_ELFIO::segment_*&,_ELFIO::segment_**>::
                operator[](this_00,uVar10);
      iVar5 = (*(*ppsVar7)->_vptr_segment[0x18])();
      if ((char)iVar5 != '\0') {
        ppsVar7 = std::_Deque_iterator<ELFIO::segment_*,_ELFIO::segment_*&,_ELFIO::segment_**>::
                  operator[](this_00,uVar10);
        iVar5 = (*(*ppsVar7)->_vptr_segment[0x11])();
        if (CONCAT44(extraout_var,iVar5) == 0) {
          ppsVar7 = std::_Deque_iterator<ELFIO::segment_*,_ELFIO::segment_*&,_ELFIO::segment_**>::
                    operator[](this_00,__n_00);
          iVar5 = (*(*ppsVar7)->_vptr_segment[0x11])();
          __n = __n_00 + (CONCAT44(extraout_var_00,iVar5) == 0);
          ppsVar7 = std::_Deque_iterator<ELFIO::segment_*,_ELFIO::segment_*&,_ELFIO::segment_**>::
                    operator[](this_00,uVar10);
          ppsVar8 = std::_Deque_iterator<ELFIO::segment_*,_ELFIO::segment_*&,_ELFIO::segment_**>::
                    operator[](this_00,__n);
          psVar3 = *ppsVar7;
          *ppsVar7 = *ppsVar8;
          *ppsVar8 = psVar3;
          __n_00 = __n + 1;
        }
      }
    }
    uVar10 = uVar10 + 1;
  }
  do {
    if (local_80._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_80._M_impl.super__Deque_impl_data._M_start._M_cur) {
      std::_Deque_base<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::~_Deque_base(&local_80)
      ;
      return __return_storage_ptr__;
    }
    local_88._M_head_impl = *local_80._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::pop_front
              ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&local_80);
    uVar10 = 0;
    while( true ) {
      sVar6 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::size
                        ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&local_80);
      seg1._M_head_impl = local_88._M_head_impl;
      if (sVar6 <= uVar10) break;
      ppsVar7 = std::_Deque_iterator<ELFIO::segment_*,_ELFIO::segment_*&,_ELFIO::segment_**>::
                operator[](this_00,uVar10);
      bVar4 = is_subsequence_of(seg1._M_head_impl,*ppsVar7);
      if (bVar4) break;
      uVar10 = uVar10 + 1;
    }
    sVar6 = std::deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_>::size
                      ((deque<ELFIO::segment_*,_std::allocator<ELFIO::segment_*>_> *)&local_80);
    if (uVar10 < sVar6) {
      std::deque<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*&>
                ((deque<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)&local_80,
                 &local_88._M_head_impl);
    }
    else {
      std::vector<ELFIO::segment*,std::allocator<ELFIO::segment*>>::emplace_back<ELFIO::segment*&>
                ((vector<ELFIO::segment*,std::allocator<ELFIO::segment*>> *)__return_storage_ptr__,
                 &local_88._M_head_impl);
    }
  } while( true );
}

Assistant:

std::vector<segment*> get_ordered_segments() const
    {
        std::vector<segment*> res;
        std::deque<segment*>  worklist;

        res.reserve( segments.size() );
        for ( const auto& seg : segments ) {
            worklist.emplace_back( seg.get() );
        }

        // Bring the segments which start at address 0 to the front
        size_t nextSlot = 0;
        for ( size_t i = 0; i < worklist.size(); ++i ) {
            if ( i != nextSlot && worklist[i]->is_offset_initialized() &&
                 worklist[i]->get_offset() == 0 ) {
                if ( worklist[nextSlot]->get_offset() == 0 ) {
                    ++nextSlot;
                }
                std::swap( worklist[i], worklist[nextSlot] );
                ++nextSlot;
            }
        }

        while ( !worklist.empty() ) {
            segment* seg = worklist.front();
            worklist.pop_front();

            size_t i = 0;
            for ( ; i < worklist.size(); ++i ) {
                if ( is_subsequence_of( seg, worklist[i] ) ) {
                    break;
                }
            }

            if ( i < worklist.size() ) {
                worklist.emplace_back( seg );
            }
            else {
                res.emplace_back( seg );
            }
        }

        return res;
    }